

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics_collector.cc
# Opt level: O3

vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *
prometheus::detail::CollectMetrics
          (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
           *__return_storage_ptr__,
          vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
          *collectables)

{
  int iVar1;
  pointer pwVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar3;
  _Atomic_word _Var4;
  pointer pwVar5;
  bool bVar6;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pwVar5 = (collectables->
           super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pwVar2 = (collectables->
           super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pwVar5 != pwVar2) {
    do {
      this = (pwVar5->super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var4 = this->_M_use_count;
        do {
          if (_Var4 == 0) goto LAB_0012a63d;
          LOCK();
          iVar1 = this->_M_use_count;
          bVar6 = _Var4 == iVar1;
          if (bVar6) {
            this->_M_use_count = _Var4 + 1;
            iVar1 = _Var4;
          }
          _Var4 = iVar1;
          UNLOCK();
        } while (!bVar6);
        peVar3 = (pwVar5->super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (peVar3 != (element_type *)0x0 && this->_M_use_count != 0) {
          (*peVar3->_vptr_Collectable[2])(&local_40);
          std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>::
          _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>>
                    ((vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>> *)
                     __return_storage_ptr__,
                     (__return_storage_ptr__->
                     super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                     )._M_impl.super__Vector_impl_data._M_finish,
                     local_40.
                     super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_40.
                     super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
                    (&local_40);
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
LAB_0012a63d:
      pwVar5 = pwVar5 + 1;
    } while (pwVar5 != pwVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<MetricFamily> CollectMetrics(
    const std::vector<std::weak_ptr<prometheus::Collectable>>& collectables) {
  auto collected_metrics = std::vector<MetricFamily>{};

  for (auto&& wcollectable : collectables) {
    auto collectable = wcollectable.lock();
    if (!collectable) {
      continue;
    }

    auto&& metrics = collectable->Collect();
    collected_metrics.insert(collected_metrics.end(),
                             std::make_move_iterator(metrics.begin()),
                             std::make_move_iterator(metrics.end()));
  }

  return collected_metrics;
}